

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ya_getopt.cc
# Opt level: O0

int ya_getopt_internal(int argc,char **argv,char *optstring,option *longopts,int *longindex,
                      int long_only)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  char *in_RCX;
  long lVar4;
  int iVar5;
  char **in_RDX;
  long in_RSI;
  int in_EDI;
  char *in_R8;
  int in_R9D;
  int *unaff_retaddr;
  int rv;
  int long_only_flag;
  int i_1;
  char *arg_1;
  char *arg;
  int i;
  int last_pos;
  undefined8 in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int local_4c;
  char *local_48;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  
  if (ya_optopt == 0x3f) {
    ya_optopt = 0;
  }
  if (posixly_correct == -1) {
    check_gnu_extension((char *)0x104a07);
  }
  if (ya_optind == 0) {
    check_gnu_extension((char *)0x104a1a);
    ya_optind = 1;
    ya_optnext = (char *)0x0;
  }
  iVar5 = ya_optind;
  iVar3 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  iVar2 = (int)*(char *)in_RDX;
  if ((iVar2 == 0x2b) || (iVar2 == 0x2d)) {
    in_RDX = (char **)((long)in_RDX + 1);
  }
  if ((ya_optnext == (char *)0x0) && (ya_getopt_internal::start != 0)) {
    ya_optind = ya_optind - (ya_getopt_internal::end - ya_getopt_internal::start);
    if (ya_optind < 1) {
      ya_optind = 1;
    }
    while( true ) {
      in_stack_ffffffffffffffd0 = iVar5 + -1;
      iVar5 = ya_getopt_internal::end + -1;
      if (ya_getopt_internal::end <= ya_getopt_internal::start) break;
      uVar1 = *(undefined8 *)(in_RSI + (long)iVar5 * 8);
      ya_getopt_internal::end = iVar5;
      for (; iVar5 < in_stack_ffffffffffffffd0; iVar5 = iVar5 + 1) {
        *(undefined8 *)(in_RSI + (long)iVar5 * 8) = *(undefined8 *)(in_RSI + (long)(iVar5 + 1) * 8);
      }
      *(undefined8 *)(in_RSI + (long)iVar5 * 8) = uVar1;
      in_stack_ffffffffffffffcc = iVar5;
      iVar5 = in_stack_ffffffffffffffd0;
    }
    ya_getopt_internal::start = 0;
    ya_getopt_internal::end = iVar5;
  }
  if (in_EDI <= ya_optind) {
    ya_optarg = (char *)0x0;
    return -1;
  }
  if (ya_optnext == (char *)0x0) {
    local_48 = *(char **)(in_RSI + (long)ya_optind * 8);
    iVar5 = is_option(local_48);
    iVar3 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    if (iVar5 == 0) {
      if (handle_nonopt_argv != 0) {
        lVar4 = (long)ya_optind;
        ya_optind = ya_optind + 1;
        ya_optarg = *(char **)(in_RSI + lVar4 * 8);
        ya_getopt_internal::start = 0;
        return 1;
      }
      if (posixly_correct != 0) {
        ya_optarg = (char *)0x0;
        return -1;
      }
      ya_getopt_internal::start = ya_optind;
      local_4c = ya_optind;
      do {
        iVar3 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
        local_4c = local_4c + 1;
        if (in_EDI <= local_4c) goto LAB_00104c66;
        iVar5 = is_option(*(char **)(in_RSI + (long)local_4c * 8));
        iVar3 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      } while (iVar5 == 0);
      ya_getopt_internal::end = local_4c;
LAB_00104c66:
      if (local_4c == in_EDI) {
        ya_optarg = (char *)0x0;
        return -1;
      }
      ya_optind = local_4c;
      local_48 = *(char **)(in_RSI + (long)local_4c * 8);
    }
    iVar5 = strcmp(local_48,"--");
    if (iVar5 == 0) {
      ya_optind = ya_optind + 1;
      return -1;
    }
    if ((in_RCX != (char *)0x0) && (local_48[1] == '-')) {
      iVar3 = ya_getopt_longopts((int)in_RSI,in_RDX,in_RCX,in_R8,
                                 (option *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
                                 (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8
                                                ),unaff_retaddr);
      return iVar3;
    }
  }
  if (ya_optnext == (char *)0x0) {
    ya_optnext = (char *)(*(long *)(in_RSI + (long)ya_optind * 8) + 1);
  }
  if (in_R9D != 0) {
    in_stack_ffffffffffffffb0 = 0;
    iVar3 = (int)((ulong)&stack0xffffffffffffffb0 >> 0x20);
    in_stack_ffffffffffffffac =
         ya_getopt_longopts((int)in_RSI,in_RDX,in_RCX,in_R8,
                            (option *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
                            (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                            unaff_retaddr);
    if (in_stack_ffffffffffffffb0 == 0) {
      ya_optnext = (char *)0x0;
      return in_stack_ffffffffffffffac;
    }
  }
  iVar3 = ya_getopt_shortopts(in_stack_ffffffffffffffb0,
                              (char **)CONCAT44(in_stack_ffffffffffffffac,iVar2),
                              in_stack_ffffffffffffffa0,iVar3);
  return iVar3;
}

Assistant:

static int ya_getopt_internal(int argc, char * const argv[], const char *optstring, const struct option *longopts, int *longindex, int long_only)
{
    static int start, end;

    if (ya_optopt == '?') {
        ya_optopt = 0;
    }

    if (posixly_correct == -1) {
        check_gnu_extension(optstring);
    }

    if (ya_optind == 0) {
        check_gnu_extension(optstring);
        ya_optind = 1;
        ya_optnext = NULL;
    }

    switch (optstring[0]) {
    case '+':
    case '-':
        optstring++;
    }

    if (ya_optnext == NULL && start != 0) {
        int last_pos = ya_optind - 1;

        ya_optind -= end - start;
        if (ya_optind <= 0) {
            ya_optind = 1;
        }
        while (start < end--) {
            int i;
            char *arg = argv[end];

            for (i = end; i < last_pos; i++) {
                ((char **)argv)[i] = argv[i + 1];
            }
            ((char const **)argv)[i] = arg;
            last_pos--;
        }
        start = 0;
    }

    if (ya_optind >= argc) {
        ya_optarg = NULL;
        return -1;
    }
    if (ya_optnext == NULL) {
        const char *arg = argv[ya_optind];
        if (!is_option(arg)) {
            if (handle_nonopt_argv) {
                ya_optarg = argv[ya_optind++];
                start = 0;
                return 1;
            } else if (posixly_correct) {
                ya_optarg = NULL;
                return -1;
            } else {
                int i;

                start = ya_optind;
                for (i = ya_optind + 1; i < argc; i++) {
                    if (is_option(argv[i])) {
                        end = i;
                        break;
                    }
                }
                if (i == argc) {
                    ya_optarg = NULL;
                    return -1;
                }
                ya_optind = i;
                arg = argv[ya_optind];
            }
        }
        if (strcmp(arg, "--") == 0) {
            ya_optind++;
            return -1;
        }
        if (longopts != NULL && arg[1] == '-') {
            return ya_getopt_longopts(argc, argv, argv[ya_optind] + 2, optstring, longopts, longindex, NULL);
        }
    }

    if (ya_optnext == NULL) {
        ya_optnext = argv[ya_optind] + 1;
    }
    if (long_only) {
        int long_only_flag = 0;
        int rv = ya_getopt_longopts(argc, argv, ya_optnext, optstring, longopts, longindex, &long_only_flag);
        if (!long_only_flag) {
            ya_optnext = NULL;
            return rv;
        }
    }

    return ya_getopt_shortopts(argc, argv, optstring, long_only);
}